

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QByteArray *
QUrl::toAce(QByteArray *__return_storage_ptr__,QString *domain,AceProcessingOptions options)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  qt_ACE_do((QString *)&local_30,domain,ToAceOnly,ForbidLeadingDot,options);
  QString::toLatin1_helper_inplace(__return_storage_ptr__,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QUrl::toAce(const QString &domain, AceProcessingOptions options)
{
    return qt_ACE_do(domain, ToAceOnly, ForbidLeadingDot /*FIXME: make configurable*/, options)
            .toLatin1();
}